

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall SSTable::SSTable(SSTable *this,path *filepath)

{
  bool bVar1;
  SSTableFileNotExistsException *this_00;
  path *filepath_local;
  SSTable *this_local;
  
  std::filesystem::__cxx11::path::path(&this->file);
  this->header = (SSTableHeader *)0x0;
  this->data = (SSTableData *)0x0;
  this->index = (SSTableIndex *)0x0;
  bVar1 = std::filesystem::exists(filepath);
  if (!bVar1) {
    this_00 = (SSTableFileNotExistsException *)__cxa_allocate_exception(8);
    *this_00 = (SSTableFileNotExistsException)0x0;
    SSTableFileNotExistsException::SSTableFileNotExistsException(this_00);
    __cxa_throw(this_00,&SSTableFileNotExistsException::typeinfo,
                SSTableFileNotExistsException::~SSTableFileNotExistsException);
  }
  std::filesystem::__cxx11::path::operator=(&this->file,filepath);
  return;
}

Assistant:

SSTable::SSTable(const path &filepath) {
    if (!exists(filepath)) {
        throw SSTableFileNotExistsException();
    }
    file = filepath;
}